

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

dataid MetaFindParam(node *p,tchar_t *Token)

{
  bool_t bVar1;
  uint *local_38;
  nodemeta *m;
  nodeclass *c;
  tchar_t *Token_local;
  node *p_local;
  
  if (Token != (tchar_t *)0x0) {
    for (m = (nodemeta *)((long)p->VMT + -0x48); m != (nodemeta *)0x0; m = (nodemeta *)m[1].Data) {
      if (m->Data != 0) {
        for (local_38 = (uint *)m->Data; (*local_38 & 0xff) != 0; local_38 = local_38 + 4) {
          if (((*local_38 & 0xff) == 0x1e) &&
             (bVar1 = tcsisame_ascii(Token,*(tchar_t **)(local_38 + 2)), bVar1 != 0)) {
            return (ulong)(*local_38 >> 8);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static dataid MetaFindParam(node* p,const tchar_t* Token)
{
    if (Token)
    {
        const nodeclass* c;
        const nodemeta* m;

        for (c = NodeGetClass(p);c;c=c->ParentClass)
            if (c->Meta) // should be registered, just fail safe
                for (m=c->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
                    if (m->Meta == META_PARAM_NAME && tcsisame_ascii(Token,(const tchar_t*)m->Data))
                    {
                        return m->Id;
                    }
    }
    return 0;
}